

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O0

uchar * kex_agree_instr(uchar *haystack,size_t haystack_len,uchar *needle,size_t needle_len)

{
  int iVar1;
  void *pvVar2;
  uchar *local_48;
  size_t left;
  uchar *end_haystack;
  uchar *s;
  size_t needle_len_local;
  uchar *needle_local;
  size_t haystack_len_local;
  uchar *haystack_local;
  
  if ((haystack == (uchar *)0x0) || (needle == (uchar *)0x0)) {
    haystack_local = (uchar *)0x0;
  }
  else if ((haystack_len < needle_len) || (needle_len == 0)) {
    haystack_local = (uchar *)0x0;
  }
  else {
    iVar1 = strncmp((char *)haystack,(char *)needle,needle_len);
    local_48 = (uchar *)haystack_len;
    end_haystack = haystack;
    if ((iVar1 != 0) ||
       ((haystack_local = haystack, needle_len != haystack_len && (haystack[needle_len] != ',')))) {
      while( true ) {
        pvVar2 = memchr(end_haystack,0x2c,(size_t)local_48);
        if (pvVar2 == (void *)0x0) {
          return (uchar *)0x0;
        }
        local_48 = haystack + (haystack_len - (long)pvVar2);
        if (((local_48 == (uchar *)0x0) || (haystack_len < local_48)) || (local_48 <= needle_len))
        break;
        end_haystack = (uchar *)((long)pvVar2 + 1);
        iVar1 = strncmp((char *)end_haystack,(char *)needle,needle_len);
        if (iVar1 == 0) {
          if (end_haystack + (needle_len - (long)haystack) == (uchar *)haystack_len) {
            return end_haystack;
          }
          if (end_haystack[needle_len] == ',') {
            return end_haystack;
          }
        }
      }
      haystack_local = (uchar *)0x0;
    }
  }
  return haystack_local;
}

Assistant:

static unsigned char *
kex_agree_instr(unsigned char *haystack, size_t haystack_len,
                const unsigned char *needle, size_t needle_len)
{
    unsigned char *s;
    unsigned char *end_haystack;
    size_t left;

    if(!haystack || !needle) {
        return NULL;
    }

    /* Haystack too short to bother trying */
    if(haystack_len < needle_len || needle_len == 0) {
        return NULL;
    }

    s = haystack;
    end_haystack = &haystack[haystack_len];
    left = end_haystack - s;

    /* Needle at start of haystack */
    if((strncmp((char *) haystack, (char *) needle, needle_len) == 0) &&
        (needle_len == haystack_len || haystack[needle_len] == ',')) {
        return haystack;
    }

    /* Search until we run out of comas or we run out of haystack,
       whichever comes first */
    /* !checksrc! disable EQUALSNULL 1 */
    while((s = (unsigned char *) memchr((char *) s, ',', left)) != NULL) {
        /* Advance buffer past coma if we can */
        left = end_haystack - s;
        if((left >= 1) && (left <= haystack_len) && (left > needle_len)) {
            s++;
        }
        else {
            return NULL;
        }

        /* Needle at X position */
        if((strncmp((char *) s, (char *) needle, needle_len) == 0) &&
            (((s - haystack) + needle_len) == haystack_len
             || s[needle_len] == ',')) {
            return s;
        }
    }

    return NULL;
}